

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicAtomicCase1::Run(BasicAtomicCase1 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  bool *compile_error;
  ulong uVar4;
  int i;
  ulong uVar5;
  long lVar6;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "\nlayout(local_size_x = 8) in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_add_output[8];\n  int g_sub_output[8];\n};\nshared uint g_add_value;\nshared int g_sub_value;\nvoid main() {\n  if (gl_LocalInvocationIndex == 0u) {\n    g_add_value = 0u;\n    g_sub_value = 7;\n  }\n  g_add_output[gl_LocalInvocationIndex] = 0u;\n  g_sub_output[gl_LocalInvocationIndex] = 0;\n  groupMemoryBarrier();\n  barrier();\n  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);\n  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);\n}"
             ,&local_51);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x20,1);
    std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar3,(long)pvVar3 + 0x20);
    lVar6 = 0;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      uVar4 = (ulong)*(uint *)((long)pvVar3 + uVar5 * 4);
      if (uVar5 != uVar4) {
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",uVar5 & 0xffffffff,uVar4,
                   uVar5 & 0xffffffff);
        lVar6 = -1;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x20,0x20,1);
    std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar3,(long)pvVar3 + 0x20);
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      uVar4 = (ulong)*(uint *)((long)pvVar3 + uVar5 * 4);
      if (uVar5 != uVar4) {
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",uVar5 & 0xffffffff,uVar4,
                   uVar5 & 0xffffffff);
        lVar6 = -1;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  else {
    lVar6 = -1;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 8) in;" NL "layout(std430, binding = 0) buffer Output {" NL
			   "  uint g_add_output[8];" NL "  int g_sub_output[8];" NL "};" NL "shared uint g_add_value;" NL
			   "shared int g_sub_value;" NL "void main() {" NL "  if (gl_LocalInvocationIndex == 0u) {" NL
			   "    g_add_value = 0u;" NL "    g_sub_value = 7;" NL "  }" NL
			   "  g_add_output[gl_LocalInvocationIndex] = 0u;" NL "  g_sub_output[gl_LocalInvocationIndex] = 0;" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL
			   "  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);" NL
			   "  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		int* data;
		data = static_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * 8, GL_MAP_READ_BIT));
		std::sort(data, data + 8);
		long error = NO_ERROR;
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		data = static_cast<int*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, sizeof(int) * 8, sizeof(int) * 8, GL_MAP_READ_BIT));
		std::sort(data, data + 8);
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}